

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O0

void __thiscall
fizplex::ColMatrix_MatrixMultiplicationWithZero_Test::TestBody
          (ColMatrix_MatrixMultiplicationWithZero_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ColMatrix idnt;
  ColMatrix zero;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  ColMatrix *lhs;
  AssertHelper in_stack_ffffffffffffff50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  ColMatrix *in_stack_ffffffffffffff80;
  AssertionResult local_78 [3];
  ColMatrix *in_stack_ffffffffffffffc0;
  ColMatrix *in_stack_ffffffffffffffc8;
  
  lhs = (ColMatrix *)0x3;
  ColMatrix::ColMatrix
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ColMatrix::identity(in_stack_ffffffffffffff68);
  ColMatrix::operator*(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  testing::internal::EqHelper<false>::Compare<fizplex::ColMatrix,fizplex::ColMatrix>
            ((char *)in_stack_ffffffffffffff58.ptr_,(char *)in_stack_ffffffffffffff50.data_,lhs,
             (ColMatrix *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  ColMatrix::~ColMatrix((ColMatrix *)0x1bbca4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff58);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1bbd2f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x60,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&stack0xffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50);
    testing::Message::~Message((Message *)0x1bbd7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1bbdbb);
  ColMatrix::~ColMatrix((ColMatrix *)0x1bbdc5);
  ColMatrix::~ColMatrix((ColMatrix *)0x1bbdd2);
  return;
}

Assistant:

TEST(ColMatrix, MatrixMultiplicationWithZero) {
  const auto zero = ColMatrix(3, 3);
  const auto idnt = ColMatrix::identity(3);
  EXPECT_EQ(zero, idnt * zero);
}